

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

QColor QtMWidgets::lighterColor(QColor *c,int b)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  QColor QVar4;
  int a;
  int v;
  int h;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  if (b < 1) {
    uVar1 = *(undefined8 *)c;
    uVar2 = *(ulong *)((long)&c->ct + 4);
  }
  else {
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    auVar3 = QColor::toHsv();
    local_40 = auVar3._0_8_;
    local_38 = auVar3._8_4_;
    local_34 = auVar3._12_2_;
    QColor::getHsv((int *)&local_40,&local_44,&local_48,&local_4c);
    local_4c = b + local_4c;
    if (0xff < local_4c) {
      local_48 = (local_48 - local_4c) + 0xff;
      if (local_48 < 1) {
        local_48 = 0;
      }
      local_4c = 0xff;
    }
    QColor::setHsv((Spec)&local_40,local_44,local_48,local_4c);
    auVar3 = QColor::convertTo((Spec)&local_40);
    uVar1 = auVar3._0_8_;
    uVar2 = auVar3._8_8_ & 0xffffffffffff;
  }
  QVar4._8_8_ = uVar2;
  QVar4._0_8_ = uVar1;
  return QVar4;
}

Assistant:

QColor
lighterColor( const QColor & c, int b )
{
	if( b <= 0 )
		return c;

	int h = 0;
	int s = 0;
	int v = 0;
	int a = 0;

	QColor hsv = c.toHsv();
	hsv.getHsv( &h, &s, &v, &a );

	v += b;

	if( v > 255 )
	{
		s -= v - 255;

		if( s < 0 ) s = 0;

		v = 255;
	}

	hsv.setHsv( h, s, v, a );

	return hsv.convertTo( c.spec() );
}